

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_bases.cc
# Opt level: O1

void google::protobuf::internal::ZeroFieldsBase::MergeImpl
               (MessageLite *to_param,MessageLite *from_param)

{
  ulong uVar1;
  Nonnull<const_char_*> pcVar2;
  
  if (from_param == to_param) {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_param,to_param,"from != to");
  }
  else {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    uVar1 = (from_param->_internal_metadata_).ptr_;
    if ((uVar1 & 1) == 0) {
      return;
    }
    InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_param->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8))
    ;
    return;
  }
  MergeImpl();
}

Assistant:

void ZeroFieldsBase::MergeImpl(MessageLite& to_param,
                               const MessageLite& from_param) {
  auto* to = static_cast<ZeroFieldsBase*>(&to_param);
  const auto* from = static_cast<const ZeroFieldsBase*>(&from_param);
  ABSL_DCHECK_NE(from, to);
  to->_internal_metadata_.MergeFrom<UnknownFieldSet>(from->_internal_metadata_);
}